

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn2612.c
# Opt level: O0

void set_timers(FM_ST *ST,void *n,int v)

{
  int v_local;
  void *n_local;
  FM_ST *ST_local;
  
  ST->mode = v;
  if ((v & 0x20U) != 0) {
    FM_STATUS_RESET(ST,2);
  }
  if ((v & 0x10U) != 0) {
    FM_STATUS_RESET(ST,1);
  }
  if ((v & 2U) == 0) {
    if ((ST->TBC != 0) && (ST->TBC = 0, ST->timer_handler != (FM_TIMERHANDLER)0x0)) {
      (*ST->timer_handler)(n,'\x01',0,ST->clock);
    }
  }
  else if (ST->TBC == 0) {
    ST->TBC = (0x100 - (uint)ST->TB) * 0x10;
    if (ST->timer_handler != (FM_TIMERHANDLER)0x0) {
      (*ST->timer_handler)(n,'\x01',ST->TBC * ST->timer_prescaler,ST->clock);
    }
    ST->TBC = ST->TBC << 0xc;
  }
  if ((v & 1U) == 0) {
    if ((ST->TAC != 0) && (ST->TAC = 0, ST->timer_handler != (FM_TIMERHANDLER)0x0)) {
      (*ST->timer_handler)(n,'\0',0,ST->clock);
    }
  }
  else if (ST->TAC == 0) {
    ST->TAC = 0x400 - ST->TA;
    if (ST->timer_handler != (FM_TIMERHANDLER)0x0) {
      (*ST->timer_handler)(n,'\0',ST->TAC * ST->timer_prescaler,ST->clock);
    }
    ST->TAC = ST->TAC << 0xc;
  }
  return;
}

Assistant:

INLINE void set_timers( FM_OPN2 *OPN, FM_ST2 *ST, void *n, int v )
{
	/* b7 = CSM MODE */
	/* b6 = 3 slot mode */
	/* b5 = reset b */
	/* b4 = reset a */
	/* b3 = timer enable b */
	/* b2 = timer enable a */
	/* b1 = load b */
	/* b0 = load a */

	if ((OPN->ST.mode ^ v) & 0xC0)
	{
		/* phase increment need to be recalculated */
		OPN->P_CH[2].SLOT[SLOT1].Incr=-1;

		/* CSM mode disabled and CSM key ON active*/
		if (((v & 0xC0) != 0x80) && OPN->SL3.key_csm)
		{
			/* CSM Mode Key OFF (verified by Nemesis on real hardware) */
			FM_KEYOFF_CSM(&OPN->P_CH[2],SLOT1);
			FM_KEYOFF_CSM(&OPN->P_CH[2],SLOT2);
			FM_KEYOFF_CSM(&OPN->P_CH[2],SLOT3);
			FM_KEYOFF_CSM(&OPN->P_CH[2],SLOT4);
			OPN->SL3.key_csm = 0;
		}
	}

	/* reload Timers */
	if ((v&1) && !(ST->mode&1))
	{
		ST->TAC = (1024-ST->TA);
		/* External timer handler */
		if (ST->timer_handler) (ST->timer_handler)(n,0,ST->TAC * ST->timer_prescaler,ST->clock);
		ST->TAC *= 4096;
	}
	else if (!(v & 1))
	{
		if( ST->TAC != 0 )
		{
			ST->TAC = 0;
			if (ST->timer_handler) (ST->timer_handler)(n,0,0,ST->clock);
		}
	}

	if ((v&2) && !(ST->mode&2))
	{
		ST->TBC = ( 256-ST->TB)<<4;
		/* External timer handler */
		if (ST->timer_handler) (ST->timer_handler)(n,1,ST->TBC * ST->timer_prescaler,ST->clock);
		ST->TBC *= 4096;
	}
	else if (!(v & 2))
	{
		if( ST->TBC != 0 )
		{
			ST->TBC = 0;
			if (ST->timer_handler) (ST->timer_handler)(n,1,0,ST->clock);
		}
	}

	/* reset Timers flags */
	ST->status &= (~v >> 4);

	/* if IRQ should be lowered now, do so */
	if ( (ST->irq) && !(ST->status & ST->irqmask) )
	{
		ST->irq = 0;
		/* callback user interrupt handler (IRQ is ON to OFF) */
		if(ST->IRQ_Handler) (ST->IRQ_Handler)(ST->param, 0);
	}
	ST->mode = v;
}